

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O0

vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections_1)

{
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *r;
  initializer_list<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>
  values;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> local_78;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> iStack_58;
  burst *local_38;
  undefined8 local_30;
  boost *local_28;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
  *collections_local_1;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *collections_local
  ;
  make_range_vector_t *this_local;
  
  local_28 = (boost *)collections_1;
  collections_local_1 = collections;
  collections_local =
       (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)this;
  this_local = (make_range_vector_t *)__return_storage_ptr__;
  boost::
  make_iterator_range<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            (&local_78,(boost *)collections,collections);
  boost::
  make_iterator_range<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            (&iStack_58,local_28,r);
  local_38 = (burst *)&local_78;
  local_30 = 2;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x2;
  make_vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            (__return_storage_ptr__,local_38,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }